

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

Iterator * __thiscall
TTD::TTEventList::GetIteratorAtFirst(Iterator *__return_storage_ptr__,TTEventList *this)

{
  TTEventListLink *pTVar1;
  EventLogEntryVTableEntry *vtable;
  size_t pos;
  TTEventListLink *head;
  
  pTVar1 = this->m_headBlock;
  if (this->m_headBlock == (TTEventListLink *)0x0) {
    vtable = this->m_vtable;
    head = (TTEventListLink *)0x0;
    pos = 0;
  }
  else {
    do {
      head = pTVar1;
      pTVar1 = head->Previous;
    } while (head->Previous != (TTEventListLink *)0x0);
    pos = head->StartPos;
    vtable = this->m_vtable;
  }
  Iterator::Iterator(__return_storage_ptr__,head,pos,vtable,&this->m_previousEventMap);
  return __return_storage_ptr__;
}

Assistant:

TTEventList::Iterator TTEventList::GetIteratorAtFirst() const
    {
        if(this->m_headBlock == nullptr)
        {
            return Iterator(nullptr, 0, this->m_vtable, &this->m_previousEventMap);
        }
        else
        {
            TTEventListLink* firstBlock = this->m_headBlock;
            while(firstBlock->Previous != nullptr)
            {
                firstBlock = firstBlock->Previous;
            }

            return Iterator(firstBlock, firstBlock->StartPos, this->m_vtable, &this->m_previousEventMap);
        }
    }